

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect_jobserver.c
# Opt level: O2

int posix(char *jobserver,char *message)

{
  int iVar1;
  int write_fd_00;
  undefined8 in_RAX;
  int read_fd;
  int write_fd;
  
  _read_fd = in_RAX;
  iVar1 = __isoc99_sscanf(jobserver,"%d,%d",&read_fd,&write_fd);
  if (iVar1 == 2) {
    iVar1 = read_fd;
    write_fd_00 = write_fd;
  }
  else {
    iVar1 = strncmp(jobserver,"fifo:",5);
    if (iVar1 != 0) {
      snprintf(message,0x3ff,"Unrecognized jobserver format: %s\n",jobserver);
      return 1;
    }
    iVar1 = open(jobserver + 5,0);
    _read_fd = CONCAT44(write_fd,iVar1);
    write_fd_00 = open(jobserver + 5,1);
    _read_fd = CONCAT44(write_fd_00,read_fd);
    iVar1 = read_fd;
  }
  iVar1 = test_fd(iVar1,write_fd_00,message);
  return iVar1;
}

Assistant:

int posix(const char* jobserver, char* message)
{
  int read_fd;
  int write_fd;

  // First try to parse as "R,W" file descriptors
  if (sscanf(jobserver, "%d,%d", &read_fd, &write_fd) == 2) {
    return test_fd(read_fd, write_fd, message);
  }

  // Then try to parse as "fifo:PATH"
  if (strncmp(jobserver, "fifo:", 5) == 0) {
    const char* path = jobserver + 5;
    read_fd = open(path, O_RDONLY);
    write_fd = open(path, O_WRONLY);
    return test_fd(read_fd, write_fd, message);
  }

  // We don't understand the format
  snprintf(message, MAX_MESSAGE_LENGTH, "Unrecognized jobserver format: %s\n",
           jobserver);
  return 1;
}